

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTriangleMeshConnected.cpp
# Opt level: O1

void __thiscall
chrono::geometry::ChTriangleMeshConnected::ArchiveIN
          (ChTriangleMeshConnected *this,ChArchiveIn *marchive)

{
  ChNameValue<std::vector<chrono::ChColor,_std::allocator<chrono::ChColor>_>_> local_38;
  
  ChArchiveIn::VersionRead<chrono::geometry::ChTriangleMeshConnected>(marchive);
  ChTriangleMesh::ArchiveIN(&this->super_ChTriangleMesh,marchive);
  local_38._value = (vector<chrono::ChColor,_std::allocator<chrono::ChColor>_> *)&this->m_vertices;
  local_38._name = "m_vertices";
  local_38._flags = '\0';
  ChArchiveIn::in<chrono::ChVector<double>>
            (marchive,(ChNameValue<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>
                       *)&local_38);
  local_38._value = (vector<chrono::ChColor,_std::allocator<chrono::ChColor>_> *)&this->m_normals;
  local_38._name = "m_normals";
  local_38._flags = '\0';
  ChArchiveIn::in<chrono::ChVector<double>>
            (marchive,(ChNameValue<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>
                       *)&local_38);
  local_38._value = (vector<chrono::ChColor,_std::allocator<chrono::ChColor>_> *)&this->m_UV;
  local_38._name = "m_UV";
  local_38._flags = '\0';
  ChArchiveIn::in<chrono::ChVector2<double>>
            (marchive,(ChNameValue<std::vector<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>_>
                       *)&local_38);
  local_38._value = &this->m_colors;
  local_38._name = "m_colors";
  local_38._flags = '\0';
  ChArchiveIn::in<chrono::ChColor>(marchive,&local_38);
  local_38._value =
       (vector<chrono::ChColor,_std::allocator<chrono::ChColor>_> *)&this->m_face_v_indices;
  local_38._name = "m_face_v_indices";
  local_38._flags = '\0';
  ChArchiveIn::in<chrono::ChVector<int>>
            (marchive,(ChNameValue<std::vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>_>
                       *)&local_38);
  local_38._value =
       (vector<chrono::ChColor,_std::allocator<chrono::ChColor>_> *)&this->m_face_n_indices;
  local_38._name = "m_face_n_indices";
  local_38._flags = '\0';
  ChArchiveIn::in<chrono::ChVector<int>>
            (marchive,(ChNameValue<std::vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>_>
                       *)&local_38);
  local_38._value =
       (vector<chrono::ChColor,_std::allocator<chrono::ChColor>_> *)&this->m_face_uv_indices;
  local_38._name = "m_face_uv_indices";
  local_38._flags = '\0';
  ChArchiveIn::in<chrono::ChVector<int>>
            (marchive,(ChNameValue<std::vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>_>
                       *)&local_38);
  local_38._value =
       (vector<chrono::ChColor,_std::allocator<chrono::ChColor>_> *)&this->m_face_col_indices;
  local_38._name = "m_face_col_indices";
  local_38._flags = '\0';
  ChArchiveIn::in<chrono::ChVector<int>>
            (marchive,(ChNameValue<std::vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>_>
                       *)&local_38);
  local_38._value =
       (vector<chrono::ChColor,_std::allocator<chrono::ChColor>_> *)&this->m_face_mat_indices;
  local_38._name = "m_face_mat_indices";
  local_38._flags = '\0';
  ChArchiveIn::in<int>(marchive,(ChNameValue<std::vector<int,_std::allocator<int>_>_> *)&local_38);
  local_38._value = (vector<chrono::ChColor,_std::allocator<chrono::ChColor>_> *)&this->m_filename;
  local_38._name = "m_filename";
  local_38._flags = '\0';
  (**(code **)(*(long *)marchive + 0x40))(marchive,&local_38);
  return;
}

Assistant:

void ChTriangleMeshConnected::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/marchive.VersionRead<ChTriangleMeshConnected>();
    // deserialize parent class
    ChTriangleMesh::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(m_vertices);
    marchive >> CHNVP(m_normals);
    marchive >> CHNVP(m_UV);
    marchive >> CHNVP(m_colors);
    marchive >> CHNVP(m_face_v_indices);
    marchive >> CHNVP(m_face_n_indices);
    marchive >> CHNVP(m_face_uv_indices);
    marchive >> CHNVP(m_face_col_indices);
    marchive >> CHNVP(m_face_mat_indices);
    marchive >> CHNVP(m_filename);
}